

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaVector.cpp
# Opt level: O2

void __thiscall NaVector::auto_cov(NaVector *this,NaVector *rVectACF)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  double extraout_XMM0_Qa;
  double dVar7;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  
  uVar1 = (*this->_vptr_NaVector[6])();
  (*rVectACF->_vptr_NaVector[4])(rVectACF,(ulong)uVar1);
  iVar2 = (*this->_vptr_NaVector[6])(this);
  if (iVar2 != 0) {
    uVar3 = (*this->_vptr_NaVector[6])(this);
    (*this->_vptr_NaVector[0x11])(this);
    uVar1 = uVar3;
    for (uVar6 = 0; uVar6 != uVar3; uVar6 = uVar6 + 1) {
      dVar7 = 0.0;
      uVar5 = 0;
      while (uVar4 = (uint)uVar5, uVar1 != uVar4) {
        (*this->_vptr_NaVector[9])(this,uVar5 % (ulong)uVar3);
        (*this->_vptr_NaVector[9])(this,(ulong)(uVar6 + uVar4) % (ulong)uVar3);
        dVar7 = dVar7 + (extraout_XMM0_Qa_01 - extraout_XMM0_Qa) *
                        (extraout_XMM0_Qa_00 - extraout_XMM0_Qa);
        uVar5 = (ulong)(uVar4 + 1);
      }
      iVar2 = (*rVectACF->_vptr_NaVector[8])(rVectACF,(ulong)uVar6);
      *(double *)CONCAT44(extraout_var,iVar2) = dVar7 / (double)uVar3;
      uVar1 = uVar1 + 1;
    }
  }
  return;
}

Assistant:

void
NaVector::auto_cov (NaVector& rVectACF) const
{
    rVectACF.new_dim(dim());

    if(0 == dim())
        return;

    unsigned    k, t, N = dim();
    NaReal      fAvg = average();

    // Compute ACF
    for(k = 0; k < N; ++k){
        NaReal  fSum = 0;
        for(t = 0; t < N + k; ++t){
            fSum += (get(t % N) - fAvg) * (get((t + k) % N) - fAvg);
        }
        rVectACF[k] = fSum / N;
    }
}